

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractlistmodel.cpp
# Opt level: O3

void QtMWidgets::AbstractListModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == dataChanged && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == modelReset && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == rowsInserted && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == rowsRemoved && lVar3 == 0) {
      *puVar1 = 3;
    }
    else if (pcVar2 == rowsMoved && lVar3 == 0) {
      *puVar1 = 4;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_30 = *_a[1];
      local_34 = *_a[2];
      iVar4 = 0;
      break;
    case 1:
      QMetaObject::activate(_o,&staticMetaObject,1,(void **)0x0);
      return;
    case 2:
      local_30 = *_a[1];
      local_34 = *_a[2];
      iVar4 = 2;
      break;
    case 3:
      local_30 = *_a[1];
      local_34 = *_a[2];
      iVar4 = 3;
      break;
    case 4:
      local_30 = *_a[1];
      local_34 = *_a[2];
      local_2c = *_a[3];
      local_10 = &local_2c;
      iVar4 = 4;
      break;
    default:
      goto switchD_001505d2_default;
    }
    local_18 = &local_34;
    local_20 = &local_30;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_28);
  }
switchD_001505d2_default:
  return;
}

Assistant:

void QtMWidgets::AbstractListModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractListModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->modelReset(); break;
        case 2: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (AbstractListModel::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::dataChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::modelReset)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::rowsInserted)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::rowsRemoved)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (AbstractListModel::*)(int , int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListModel::rowsMoved)) {
                *result = 4;
                return;
            }
        }
    }
}